

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O1

void __thiscall gmath::PinholeCamera::setA(PinholeCamera *this,Matrix33d *AA)

{
  undefined1 auVar1 [16];
  int k;
  int iVar2;
  long lVar3;
  IOException *this_00;
  Matrix33d *pMVar4;
  int i;
  long lVar5;
  ostringstream out;
  allocator local_1d1;
  char *local_1d0;
  string local_1b0;
  ostringstream local_190 [376];
  
  lVar3 = 0;
  pMVar4 = &this->A;
  do {
    lVar5 = 0;
    do {
      pMVar4->v[0][lVar5] = (*(double (*) [3])*(double (*) [3])AA)[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    pMVar4 = (Matrix33d *)(pMVar4->v + 1);
    AA = (Matrix33d *)((long)AA + 0x18);
  } while (lVar3 != 3);
  auVar1._4_4_ = -(uint)((this->A).v[2][0] != 0.0);
  auVar1._0_4_ = -(uint)((this->A).v[1][0] != 0.0);
  auVar1._8_4_ = -(uint)((this->A).v[2][1] != 0.0);
  auVar1._12_4_ = -(uint)((this->A).v[2][2] != 1.0);
  iVar2 = movmskps(3,auVar1);
  if (iVar2 == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Invalid camera matrix: ",0x17);
  operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_190,&this->A);
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_1b0,local_1d0,&local_1d1);
  gutil::IOException::IOException(this_00,&local_1b0);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PinholeCamera::setA(const Matrix33d &AA)
{
  A=AA;

  if (A(1, 0) != 0 || A(2, 0) != 0 || A(2, 1) != 0 || A(2, 2) != 1)
  {
    std::ostringstream out;
    out << "Invalid camera matrix: " << A;
    throw gutil::IOException(out.str().c_str());
  }
}